

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O0

int mt_dec_decode(MpiDecTestCmd *cmd)

{
  MppCodingType MVar1;
  MppParam param;
  MpiDecTestCmd *pMStack_110;
  MppPollType timeout;
  MpiDecMtLoopData data;
  pthread_attr_t attr;
  pthread_t thd_out;
  pthread_t thd_in;
  MppCodingType type;
  RK_U32 height;
  RK_U32 width;
  RK_U32 need_split;
  MppDecCfg cfg;
  MppFrame frame;
  MppPacket packet;
  MppApi *mpi;
  MppCtx ctx;
  FileReader reader;
  MpiDecTestCmd *pMStack_10;
  MPP_RET ret;
  MpiDecTestCmd *cmd_local;
  
  reader._4_4_ = MPP_OK;
  ctx = cmd->reader;
  mpi = (MppApi *)0x0;
  packet = (MppPacket)0x0;
  frame = (MppFrame)0x0;
  cfg = (MppDecCfg)0x0;
  _width = 0;
  height = 1;
  type = cmd->width;
  thd_in._4_4_ = cmd->height;
  thd_in._0_4_ = cmd->type;
  attr._48_8_ = 0;
  pMStack_10 = cmd;
  _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test start\n",0);
  memset(&stack0xfffffffffffffef0,0,0x70);
  if ((pMStack_10->have_output == 0) ||
     (data.frame = fopen(pMStack_10->file_output,"w+b"), (FILE *)data.frame != (FILE *)0x0)) {
    reader._4_4_ = dec_buf_mgr_init(&data.buf);
    if (reader._4_4_ == MPP_OK) {
      reader._4_4_ = mpp_packet_init(&frame,0);
      if (reader._4_4_ == MPP_OK) {
        MVar1 = (MppCodingType)thd_in;
        _mpp_log_l(4,"mpi_dec_mt_test","mpi_dec_mt_test decoder test start w %d h %d type %d\n",0,
                   type,thd_in._4_4_,(MppCodingType)thd_in);
        reader._4_4_ = mpp_create(&mpi,&packet);
        if (reader._4_4_ == MPP_OK) {
          reader._4_4_ = mpp_init(mpi,0,(MppCodingType)thd_in);
          if (reader._4_4_ == MPP_OK) {
            param._4_4_ = 0xffffffff;
            reader._4_4_ = (**(code **)((long)packet + 0x70))(mpi,0x200007,(long)&param + 4);
            if (reader._4_4_ == MPP_OK) {
              mpp_dec_cfg_init(&width);
              reader._4_4_ = (**(code **)((long)packet + 0x70))(mpi,0x310202,_width);
              if (reader._4_4_ == MPP_OK) {
                reader._4_4_ = mpp_dec_cfg_set_u32(_width,"base:split_parse",height);
                if (reader._4_4_ == MPP_OK) {
                  reader._4_4_ = (**(code **)((long)packet + 0x70))(mpi,0x310201,_width);
                  if (reader._4_4_ == MPP_OK) {
                    pMStack_110 = pMStack_10;
                    data.cmd = (MpiDecTestCmd *)mpi;
                    data.ctx = packet;
                    data.mpi._0_4_ = 0;
                    data.frm_grp = frame;
                    data.packet_size = (size_t)cfg;
                    data.fp_output._0_4_ = 0;
                    data.fp_output._4_4_ = pMStack_10->frame_num;
                    data._88_8_ = ctx;
                    data.reader._0_4_ = pMStack_10->quiet;
                    pthread_attr_init((pthread_attr_t *)&data.quiet);
                    pthread_attr_setdetachstate((pthread_attr_t *)&data.quiet,0);
                    reader._4_4_ = pthread_create(&thd_out,(pthread_attr_t *)&data.quiet,
                                                  thread_input,&stack0xfffffffffffffef0);
                    if (reader._4_4_ == 0) {
                      reader._4_4_ = pthread_create((pthread_t *)(attr.__size + 0x30),
                                                    (pthread_attr_t *)&data.quiet,thread_output,
                                                    &stack0xfffffffffffffef0);
                      if (reader._4_4_ == 0) {
                        if (pMStack_10->frame_num < 0) {
                          _mpp_log_l(4,"mpi_dec_mt_test",
                                     "*******************************************\n",0);
                          _mpp_log_l(4,"mpi_dec_mt_test",
                                     "**** Press Enter to stop loop decoding ****\n",0);
                          _mpp_log_l(4,"mpi_dec_mt_test",
                                     "*******************************************\n",0);
                          getc(_stdin);
                          data.mpi._0_4_ = 1;
                        }
                      }
                      else {
                        _mpp_log_l(2,"mpi_dec_mt_test","failed to create thread for output ret %d\n"
                                   ,0,reader._4_4_);
                      }
                    }
                    else {
                      _mpp_log_l(2,"mpi_dec_mt_test","failed to create thread for input ret %d\n",0,
                                 reader._4_4_);
                    }
                    pthread_attr_destroy((pthread_attr_t *)&data.quiet);
                    pthread_join(thd_out,(void **)0x0);
                    pthread_join(attr._48_8_,(void **)0x0);
                    reader._4_4_ = (**(code **)((long)packet + 0x68))(mpi);
                    if (reader._4_4_ != MPP_OK) {
                      _mpp_log_l(2,"mpi_dec_mt_test","mpi->reset failed\n",0);
                    }
                  }
                  else {
                    _mpp_log_l(2,"mpi_dec_mt_test","%p failed to set cfg %p ret %d\n",0,mpi,_width,
                               reader._4_4_);
                  }
                }
                else {
                  _mpp_log_l(2,"mpi_dec_mt_test","%p failed to set split_parse ret %d\n",0,mpi,
                             reader._4_4_);
                }
              }
              else {
                _mpp_log_l(2,"mpi_dec_mt_test","%p failed to get decoder cfg ret %d\n",0,mpi,
                           reader._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"mpi_dec_mt_test","Failed to set output timeout %d ret %d\n",0,
                         param._4_4_,reader._4_4_,MVar1);
            }
          }
          else {
            _mpp_log_l(2,"mpi_dec_mt_test","mpp_init failed\n",0);
          }
        }
        else {
          _mpp_log_l(2,"mpi_dec_mt_test","mpp_create failed\n",0);
        }
      }
      else {
        _mpp_log_l(2,"mpi_dec_mt_test","mpp_packet_init failed\n",0);
      }
    }
    else {
      _mpp_log_l(2,"mpi_dec_mt_test","dec_buf_mgr_init failed\n",0);
    }
  }
  else {
    _mpp_log_l(2,"mpi_dec_mt_test","failed to open output file %s\n",0,pMStack_10->file_output);
  }
  if (frame != (MppFrame)0x0) {
    mpp_packet_deinit(&frame);
    frame = (MppFrame)0x0;
  }
  if (cfg != (MppDecCfg)0x0) {
    mpp_frame_deinit(&cfg);
    cfg = (MppDecCfg)0x0;
  }
  if (mpi != (MppApi *)0x0) {
    mpp_destroy(mpi);
    mpi = (MppApi *)0x0;
  }
  data.buf_mgr = (DecBufMgr)0x0;
  if (data.buf != (char *)0x0) {
    dec_buf_mgr_deinit(data.buf);
    data.buf = (char *)0x0;
  }
  if (data.frame != (MppFrame)0x0) {
    fclose((FILE *)data.frame);
    data.frame = (MppFrame)0x0;
  }
  if (_width != 0) {
    mpp_dec_cfg_deinit(_width);
  }
  return reader._4_4_;
}

Assistant:

int mt_dec_decode(MpiDecTestCmd *cmd)
{
    MPP_RET ret         = MPP_OK;
    FileReader reader   = cmd->reader;

    // base flow context
    MppCtx ctx          = NULL;
    MppApi *mpi         = NULL;

    // input / output
    MppPacket packet    = NULL;
    MppFrame  frame     = NULL;

    // config for runtime mode
    MppDecCfg cfg       = NULL;
    RK_U32 need_split   = 1;

    // paramter for resource malloc
    RK_U32 width        = cmd->width;
    RK_U32 height       = cmd->height;
    MppCodingType type  = cmd->type;

    pthread_t thd_in;
    pthread_t thd_out = 0;
    pthread_attr_t attr;
    MpiDecMtLoopData data;

    mpp_log("mpi_dec_mt_test start\n");
    memset(&data, 0, sizeof(data));

    if (cmd->have_output) {
        data.fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == data.fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            goto MPP_TEST_OUT;
        }
    }

    ret = dec_buf_mgr_init(&data.buf_mgr);
    if (ret) {
        mpp_err("dec_buf_mgr_init failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_packet_init(&packet, NULL, 0);
    if (ret) {
        mpp_err("mpp_packet_init failed\n");
        goto MPP_TEST_OUT;
    }

    mpp_log("mpi_dec_mt_test decoder test start w %d h %d type %d\n", width, height, type);

    // decoder demo
    ret = mpp_create(&ctx, &mpi);
    if (ret) {
        mpp_err("mpp_create failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_init(ctx, MPP_CTX_DEC, type);
    if (ret) {
        mpp_err("mpp_init failed\n");
        goto MPP_TEST_OUT;
    }

    // NOTE: timeout value please refer to MppPollType definition
    //  0   - non-block call (default)
    // -1   - block call
    // +val - timeout value in ms
    {
        MppPollType timeout = MPP_POLL_BLOCK;
        MppParam param = &timeout;

        ret = mpi->control(ctx, MPP_SET_OUTPUT_TIMEOUT, param);
        if (ret) {
            mpp_err("Failed to set output timeout %d ret %d\n", timeout, ret);
            goto MPP_TEST_OUT;
        }
    }

    mpp_dec_cfg_init(&cfg);

    /* get default config from decoder context */
    ret = mpi->control(ctx, MPP_DEC_GET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to get decoder cfg ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    /*
     * split_parse is to enable mpp internal frame spliter when the input
     * packet is not aplited into frames.
     */
    ret = mpp_dec_cfg_set_u32(cfg, "base:split_parse", need_split);
    if (ret) {
        mpp_err("%p failed to set split_parse ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    ret = mpi->control(ctx, MPP_DEC_SET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to set cfg %p ret %d\n", ctx, cfg, ret);
        goto MPP_TEST_OUT;
    }

    data.cmd            = cmd;
    data.ctx            = ctx;
    data.mpi            = mpi;
    data.loop_end       = 0;
    data.packet         = packet;
    data.frame          = frame;
    data.frame_count    = 0;
    data.frame_num      = cmd->frame_num;
    data.reader         = reader;
    data.quiet          = cmd->quiet;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    ret = pthread_create(&thd_in, &attr, thread_input, &data);
    if (ret) {
        mpp_err("failed to create thread for input ret %d\n", ret);
        goto THREAD_END;
    }

    ret = pthread_create(&thd_out, &attr, thread_output, &data);
    if (ret) {
        mpp_err("failed to create thread for output ret %d\n", ret);
        goto THREAD_END;
    }

    if (cmd->frame_num < 0) {
        // wait for input then quit decoding
        mpp_log("*******************************************\n");
        mpp_log("**** Press Enter to stop loop decoding ****\n");
        mpp_log("*******************************************\n");

        getc(stdin);
        data.loop_end = 1;
    }

THREAD_END:
    pthread_attr_destroy(&attr);

    pthread_join(thd_in, NULL);
    pthread_join(thd_out, NULL);

    ret = mpi->reset(ctx);
    if (ret) {
        mpp_err("mpi->reset failed\n");
        goto MPP_TEST_OUT;
    }

MPP_TEST_OUT:
    if (packet) {
        mpp_packet_deinit(&packet);
        packet = NULL;
    }

    if (frame) {
        mpp_frame_deinit(&frame);
        frame = NULL;
    }

    if (ctx) {
        mpp_destroy(ctx);
        ctx = NULL;
    }

    data.frm_grp = NULL;
    if (data.buf_mgr) {
        dec_buf_mgr_deinit(data.buf_mgr);
        data.buf_mgr = NULL;
    }

    if (data.fp_output) {
        fclose(data.fp_output);
        data.fp_output = NULL;
    }

    if (cfg) {
        mpp_dec_cfg_deinit(cfg);
        cfg = NULL;
    }

    return ret;
}